

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void __thiscall ncnn::Net::clear(Net *this)

{
  uint uVar1;
  Layer *pLVar2;
  pointer poVar3;
  pointer pcVar4;
  layer_destroyer_func p_Var5;
  PoolAllocator *pPVar6;
  int iVar7;
  pointer ppLVar8;
  NetPrivate *pNVar9;
  pointer ppLVar10;
  long lVar11;
  long lVar12;
  pointer poVar13;
  ulong uVar14;
  Option opt1;
  Option local_70;
  
  std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::_M_erase_at_end
            (&this->d->blobs,
             (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
             super__Vector_impl_data._M_start);
  pNVar9 = this->d;
  ppLVar8 = (pNVar9->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar10 = (pNVar9->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar10 != ppLVar8) {
    uVar14 = 0;
    do {
      pLVar2 = ppLVar8[uVar14];
      get_masked_option(&local_70,&this->opt,pLVar2->featmask);
      iVar7 = (*pLVar2->_vptr_Layer[5])(pLVar2,&local_70);
      if (iVar7 != 0) {
        clear();
      }
      uVar1 = pLVar2->typeindex;
      if ((uVar1 >> 8 & 1) == 0) {
        poVar3 = (this->d->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = -1;
        lVar11 = (long)(this->d->overwrite_builtin_layer_registry).
                       super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)poVar3;
        if (lVar11 != 0) {
          lVar11 = lVar11 >> 5;
          lVar12 = 0;
          poVar13 = poVar3;
          do {
            if (poVar13->typeindex == uVar1) {
              iVar7 = (int)lVar12;
              break;
            }
            lVar12 = lVar12 + 1;
            poVar13 = poVar13 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
        }
        if (iVar7 != -1) {
          if (poVar3[iVar7].destroyer != (layer_destroyer_func)0x0) {
            (*poVar3[iVar7].destroyer)(pLVar2,poVar3[iVar7].userdata);
            goto LAB_0016eb9b;
          }
        }
LAB_0016eb91:
        (*pLVar2->_vptr_Layer[1])(pLVar2);
      }
      else {
        pcVar4 = (this->d->custom_layer_registry).
                 super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var5 = pcVar4[(long)(int)uVar1 & 0x7fffffffffffeffU].destroyer;
        if (p_Var5 == (layer_destroyer_func)0x0) goto LAB_0016eb91;
        (*p_Var5)(pLVar2,pcVar4[(long)(int)uVar1 & 0x7fffffffffffeffU].userdata);
      }
LAB_0016eb9b:
      uVar14 = uVar14 + 1;
      pNVar9 = this->d;
      ppLVar8 = (pNVar9->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppLVar10 = (pNVar9->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar14 < (ulong)((long)ppLVar10 - (long)ppLVar8 >> 3));
  }
  if (ppLVar10 != ppLVar8) {
    (pNVar9->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar8;
  }
  if (pNVar9->local_blob_allocator != (PoolAllocator *)0x0) {
    (*(pNVar9->local_blob_allocator->super_Allocator)._vptr_Allocator[1])();
    this->d->local_blob_allocator = (PoolAllocator *)0x0;
  }
  pPVar6 = this->d->local_workspace_allocator;
  if (pPVar6 != (PoolAllocator *)0x0) {
    (*(pPVar6->super_Allocator)._vptr_Allocator[1])();
    this->d->local_workspace_allocator = (PoolAllocator *)0x0;
  }
  return;
}

Assistant:

void Net::clear()
{
    d->blobs.clear();
    for (size_t i = 0; i < d->layers.size(); i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = get_masked_option(opt, layer->featmask);
#if NCNN_VULKAN
        if (!layer->support_image_storage)
        {
            opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int dret = layer->destroy_pipeline(opt1);
        if (dret != 0)
        {
            NCNN_LOGE("layer destroy_pipeline failed");
            // ignore anyway
        }

        if (layer->typeindex & ncnn::LayerType::CustomBit)
        {
            int custom_index = layer->typeindex & ~ncnn::LayerType::CustomBit;
            if (d->custom_layer_registry[custom_index].destroyer)
            {
                d->custom_layer_registry[custom_index].destroyer(layer, d->custom_layer_registry[custom_index].userdata);
            }
            else
            {
                delete layer;
            }
        }
        else
        {
            // check overwrite builtin layer destroyer
            int index = -1;
            const size_t overwrite_builtin_layer_registry_entry_count = d->overwrite_builtin_layer_registry.size();
            for (size_t i = 0; i < overwrite_builtin_layer_registry_entry_count; i++)
            {
                if (d->overwrite_builtin_layer_registry[i].typeindex == layer->typeindex)
                {
                    index = i;
                    break;
                }
            }

            if (index != -1 && d->overwrite_builtin_layer_registry[index].destroyer)
            {
                d->overwrite_builtin_layer_registry[index].destroyer(layer, d->overwrite_builtin_layer_registry[index].userdata);
            }
            else
            {
                delete layer;
            }
        }
    }
    d->layers.clear();

    if (d->local_blob_allocator)
    {
        delete d->local_blob_allocator;
        d->local_blob_allocator = 0;
    }
    if (d->local_workspace_allocator)
    {
        delete d->local_workspace_allocator;
        d->local_workspace_allocator = 0;
    }

#if NCNN_VULKAN
    if (d->weight_vkallocator)
    {
        delete d->weight_vkallocator;
        d->weight_vkallocator = 0;
    }
    if (d->weight_staging_vkallocator)
    {
        delete d->weight_staging_vkallocator;
        d->weight_staging_vkallocator = 0;
    }
    if (d->pipeline_cache)
    {
        delete d->pipeline_cache;
        d->pipeline_cache = 0;
        opt.pipeline_cache = 0;
    }
#endif // NCNN_VULKAN
}